

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O1

void __thiscall embree::Camera::rotateOrbit(Camera *this,float dtheta,float dphi)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  vfloat4 a;
  float fVar14;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar9 [16];
  
  if (this->handedness == RIGHT_HANDED) {
    dtheta = -dtheta;
  }
  fVar21 = (this->up).field_0.m128[0];
  fVar22 = (this->up).field_0.m128[1];
  fVar23 = (this->up).field_0.m128[2];
  fVar2 = (this->up).field_0.m128[3];
  fVar10 = fVar22 * fVar22;
  fVar13 = fVar23 * fVar23;
  fVar14 = fVar2 * fVar2;
  fVar15 = fVar10 + fVar21 * fVar21 + fVar13;
  fVar17 = fVar10 + fVar10 + fVar14;
  fVar13 = fVar10 + fVar13 + fVar13;
  fVar14 = fVar10 + fVar14 + fVar14;
  auVar7._4_4_ = fVar17;
  auVar7._0_4_ = fVar15;
  auVar7._8_4_ = fVar13;
  auVar7._12_4_ = fVar14;
  auVar8._4_4_ = fVar17;
  auVar8._0_4_ = fVar15;
  auVar8._8_4_ = fVar13;
  auVar8._12_4_ = fVar14;
  auVar8 = rsqrtss(auVar7,auVar8);
  fVar10 = auVar8._0_4_;
  fVar20 = fVar10 * 1.5 - fVar10 * fVar10 * fVar15 * 0.5 * fVar10;
  fVar21 = fVar20 * fVar21;
  fVar22 = fVar20 * fVar22;
  fVar23 = fVar20 * fVar23;
  fVar20 = fVar20 * fVar2;
  fVar2 = (this->to).field_0.m128[0] - (this->from).field_0.m128[0];
  fVar14 = (this->to).field_0.m128[1] - (this->from).field_0.m128[1];
  fVar10 = (this->to).field_0.m128[2] - (this->from).field_0.m128[2];
  fVar13 = (this->to).field_0.m128[3] - (this->from).field_0.m128[3];
  fVar15 = fVar14 * fVar14;
  fVar17 = fVar10 * fVar10;
  fVar13 = fVar13 * fVar13;
  fVar6 = fVar15 + fVar2 * fVar2 + fVar17;
  auVar9._0_8_ = CONCAT44(fVar15 + fVar15 + fVar13,fVar6);
  auVar9._8_4_ = fVar15 + fVar17 + fVar17;
  auVar9._12_4_ = fVar15 + fVar13 + fVar13;
  auVar4._8_4_ = auVar9._8_4_;
  auVar4._0_8_ = auVar9._0_8_;
  auVar4._12_4_ = auVar9._12_4_;
  auVar8 = rsqrtss(auVar4,auVar9);
  fVar13 = auVar8._0_4_;
  fVar16 = fVar13 * 1.5 - fVar13 * fVar13 * fVar6 * 0.5 * fVar13;
  fVar2 = fVar16 * fVar2;
  fVar14 = fVar16 * fVar14;
  fVar16 = fVar16 * fVar10;
  fVar10 = fVar22 * fVar22;
  fVar13 = fVar23 * fVar23;
  fVar15 = fVar20 * fVar20;
  fVar17 = fVar10 + fVar21 * fVar21 + fVar13;
  auVar5._0_8_ = CONCAT44(fVar10 + fVar10 + fVar15,fVar17);
  auVar5._8_4_ = fVar10 + fVar13 + fVar13;
  auVar5._12_4_ = fVar10 + fVar15 + fVar15;
  auVar3._8_4_ = auVar5._8_4_;
  auVar3._0_8_ = auVar5._0_8_;
  auVar3._12_4_ = auVar5._12_4_;
  auVar8 = rsqrtss(auVar3,auVar5);
  fVar10 = auVar8._0_4_;
  fVar15 = fVar10 * 1.5 - fVar10 * fVar10 * fVar17 * 0.5 * fVar10;
  fVar17 = fVar15 * fVar21;
  fVar11 = fVar15 * fVar22;
  fVar15 = fVar15 * fVar23;
  fVar10 = sinf(dtheta);
  fVar13 = cosf(dtheta);
  fVar19 = 1.0 - fVar13;
  fVar6 = fVar16 * (fVar19 * fVar15 * fVar17 + fVar11 * fVar10) +
          fVar14 * (fVar19 * fVar17 * fVar11 + fVar10 * -fVar15) +
          fVar2 * ((1.0 - fVar17 * fVar17) * fVar13 + fVar17 * fVar17);
  fVar12 = fVar16 * (fVar19 * fVar15 * fVar11 + -fVar17 * fVar10) +
           fVar14 * (fVar11 * fVar11 + fVar13 * (1.0 - fVar11 * fVar11)) +
           fVar2 * (fVar17 * fVar11 * fVar19 + fVar10 * fVar15);
  fVar13 = fVar16 * ((1.0 - fVar15 * fVar15) * fVar13 + fVar15 * fVar15) +
           fVar14 * (fVar15 * fVar11 * fVar19 + fVar17 * fVar10) +
           fVar2 * (fVar15 * fVar17 * fVar19 - fVar11 * fVar10);
  fVar14 = fVar16 * 0.0 + fVar14 * 0.0 + fVar2 * 0.0;
  fVar2 = acosf(fVar23 * fVar13 + fVar22 * fVar12 + fVar21 * fVar6);
  fVar10 = fVar2 - dphi;
  if (3.138451 <= fVar10) {
    fVar10 = 3.138451;
  }
  fVar15 = 0.003141593;
  if (0.003141593 <= fVar10) {
    fVar15 = fVar10;
  }
  fVar16 = fVar22 * fVar6 - fVar12 * fVar21;
  fVar17 = fVar23 * fVar12 - fVar13 * fVar22;
  fVar11 = fVar21 * fVar13 - fVar6 * fVar23;
  fVar10 = fVar20 * fVar14 - fVar14 * fVar20;
  fVar14 = fVar17 * fVar17;
  fVar23 = fVar11 * fVar11;
  fVar10 = fVar10 * fVar10;
  fVar21 = fVar23 + fVar14 + fVar16 * fVar16;
  fVar22 = fVar10 + fVar14 + fVar14;
  fVar23 = fVar23 + fVar14 + fVar23;
  fVar10 = fVar10 + fVar14 + fVar10;
  auVar18._4_4_ = fVar22;
  auVar18._0_4_ = fVar21;
  auVar18._8_4_ = fVar23;
  auVar18._12_4_ = fVar10;
  auVar1._4_4_ = fVar22;
  auVar1._0_4_ = fVar21;
  auVar1._8_4_ = fVar23;
  auVar1._12_4_ = fVar10;
  auVar8 = rsqrtss(auVar18,auVar1);
  fVar22 = auVar8._0_4_;
  fVar14 = fVar22 * 1.5 - fVar22 * fVar22 * fVar21 * 0.5 * fVar22;
  fVar17 = fVar14 * fVar17;
  fVar11 = fVar14 * fVar11;
  fVar14 = fVar14 * fVar16;
  fVar21 = sinf(fVar2 - fVar15);
  fVar22 = cosf(fVar2 - fVar15);
  fVar15 = 1.0 - fVar22;
  fVar23 = (this->to).field_0.m128[0] - (this->from).field_0.m128[0];
  fVar2 = (this->to).field_0.m128[1] - (this->from).field_0.m128[1];
  fVar10 = (this->to).field_0.m128[2] - (this->from).field_0.m128[2];
  fVar23 = fVar10 * fVar10 + fVar2 * fVar2 + fVar23 * fVar23;
  if (fVar23 < 0.0) {
    fVar23 = sqrtf(fVar23);
  }
  else {
    fVar23 = SQRT(fVar23);
  }
  fVar2 = (this->to).field_0.m128[1];
  fVar10 = (this->to).field_0.m128[2];
  fVar16 = (this->to).field_0.m128[3];
  (this->from).field_0.m128[0] =
       (this->to).field_0.m128[0] -
       fVar23 * (fVar13 * (fVar15 * fVar14 * fVar17 + fVar11 * fVar21) +
                 fVar12 * (fVar15 * fVar17 * fVar11 + fVar21 * -fVar14) +
                fVar6 * ((1.0 - fVar17 * fVar17) * fVar22 + fVar17 * fVar17));
  (this->from).field_0.m128[1] =
       fVar2 - fVar23 * (fVar13 * (fVar15 * fVar14 * fVar11 + -fVar17 * fVar21) +
                         fVar12 * (fVar11 * fVar11 + fVar22 * (1.0 - fVar11 * fVar11)) +
                        fVar6 * (fVar17 * fVar11 * fVar15 + fVar21 * fVar14));
  (this->from).field_0.m128[2] =
       fVar10 - fVar23 * (fVar13 * ((1.0 - fVar14 * fVar14) * fVar22 + fVar14 * fVar14) +
                          fVar12 * (fVar14 * fVar11 * fVar15 + fVar17 * fVar21) +
                         fVar6 * (fVar14 * fVar17 * fVar15 - fVar11 * fVar21));
  (this->from).field_0.m128[3] = fVar16 - fVar23 * (fVar13 * 0.0 + fVar12 * 0.0 + fVar6 * 0.0);
  return;
}

Assistant:

void rotateOrbit (float dtheta, float dphi)
    {
      if (handedness == RIGHT_HANDED) dtheta *= -1.0f;
      const Vec3fa up1 = normalize(up);
      Vec3fa view1 = normalize(to-from);
      view1 = xfmVector(AffineSpace3fa::rotate(up1, dtheta), view1);
      const float phi = acosf(dot(view1, up1));
      const float dphi2 = phi - clamp(phi-dphi, 0.001f*float(pi), 0.999f*float(pi));
      view1 = xfmVector(AffineSpace3fa::rotate(cross(view1, up1), dphi2), view1);
      from = to - length(to-from) * view1;
    }